

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf_avx2.c
# Opt level: O0

void uavs3d_alf_one_lcu_one_chroma_avx2
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  ushort uVar130;
  undefined8 *puVar131;
  int in_ECX;
  undefined1 (*in_RDX) [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  int in_R9D;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  ushort *in_stack_00000008;
  int endPos;
  int startPos;
  int j;
  int i;
  __m256i uv_mask;
  __m256i mMax;
  __m256i mZero;
  __m256i mAddOffset;
  __m256i SS4;
  __m256i SS3;
  __m256i SS2;
  __m256i SS1;
  __m256i S83;
  __m256i S82;
  __m256i S81;
  __m256i S80;
  __m256i S71;
  __m256i S70;
  __m256i S61;
  __m256i S60;
  __m256i S7;
  __m256i S6;
  __m256i S51;
  __m256i S50;
  __m256i S5;
  __m256i S41;
  __m256i S40;
  __m256i S4;
  __m256i S31;
  __m256i S30;
  __m256i S3;
  __m256i S21;
  __m256i S20;
  __m256i S2;
  __m256i S11;
  __m256i S10;
  __m256i S1;
  __m256i S01;
  __m256i S00;
  __m256i S0;
  __m256i C8;
  __m256i C7;
  __m256i C6;
  __m256i C5;
  __m256i C4;
  __m256i C3;
  __m256i C2;
  __m256i C1;
  __m256i C0;
  __m256i E11;
  __m256i E10;
  __m256i E01;
  __m256i E00;
  __m256i T711;
  __m256i T710;
  __m256i T701;
  __m256i T700;
  __m256i T611;
  __m256i T610;
  __m256i T601;
  __m256i T600;
  __m256i T511;
  __m256i T510;
  __m256i T501;
  __m256i T500;
  __m256i T411;
  __m256i T410;
  __m256i T401;
  __m256i T400;
  __m256i T301;
  __m256i T300;
  __m256i T311;
  __m256i T310;
  __m256i T211;
  __m256i T210;
  __m256i T201;
  __m256i T200;
  __m256i T111;
  __m256i T110;
  __m256i T101;
  __m256i T100;
  __m256i T011;
  __m256i T010;
  __m256i T001;
  __m256i T000;
  __m256i T8;
  __m256i T81;
  __m256i T80;
  __m256i T71;
  __m256i T70;
  __m256i T61;
  __m256i T60;
  __m256i T51;
  __m256i T50;
  __m256i T41;
  __m256i T40;
  __m256i T31;
  __m256i T30;
  __m256i T21;
  __m256i T20;
  __m256i T11;
  __m256i T10;
  __m256i T01;
  __m256i T00;
  pel *imgPad6;
  pel *imgPad5;
  pel *imgPad4;
  pel *imgPad3;
  pel *imgPad2;
  pel *imgPad1;
  int local_4668;
  int local_4664;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined1 (*local_39c8) [32];
  undefined1 (*local_39c0) [32];
  undefined1 (*local_39b8) [32];
  undefined1 (*local_39b0) [32];
  undefined1 (*local_39a8) [32];
  undefined1 (*local_39a0) [32];
  undefined1 (*local_3988) [32];
  undefined1 (*local_3978) [32];
  undefined1 local_3440 [16];
  undefined8 local_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 local_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 local_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 local_33d0;
  undefined8 uStack_33c8;
  undefined1 local_3340 [16];
  undefined8 local_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 local_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 local_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 local_32d0;
  undefined8 uStack_32c8;
  undefined1 local_3240 [16];
  undefined1 local_3220 [16];
  undefined1 local_3200 [16];
  undefined8 local_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 local_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 local_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 local_3190;
  undefined8 uStack_3188;
  undefined1 local_3100 [16];
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
  auVar2 = vpinsrw_avx(auVar2,0,2);
  auVar2 = vpinsrw_avx(auVar2,0,3);
  auVar2 = vpinsrw_avx(auVar2,0,4);
  auVar2 = vpinsrw_avx(auVar2,0,5);
  auVar2 = vpinsrw_avx(auVar2,0,6);
  auVar3 = vpinsrw_avx(auVar2,0,7);
  auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
  auVar2 = vpinsrw_avx(auVar2,0,2);
  auVar2 = vpinsrw_avx(auVar2,0,3);
  auVar2 = vpinsrw_avx(auVar2,0,4);
  auVar2 = vpinsrw_avx(auVar2,0,5);
  auVar2 = vpinsrw_avx(auVar2,0,6);
  auVar2 = vpinsrw_avx(auVar2,0,7);
  uStack_370 = auVar2._0_8_;
  uStack_368 = auVar2._8_8_;
  uVar130 = (short)(1 << ((byte)coef & 0x1f)) - 1;
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar4 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_330 = auVar2._0_8_;
  uStack_328 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar2 = vpinsrw_avx(auVar2,0xff,2);
  auVar2 = vpinsrw_avx(auVar2,0xff,3);
  auVar2 = vpinsrw_avx(auVar2,0xff,4);
  auVar2 = vpinsrw_avx(auVar2,0xff,5);
  auVar2 = vpinsrw_avx(auVar2,0xff,6);
  auVar5 = vpinsrw_avx(auVar2,0xff,7);
  auVar2 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar2 = vpinsrw_avx(auVar2,0xff,2);
  auVar2 = vpinsrw_avx(auVar2,0xff,3);
  auVar2 = vpinsrw_avx(auVar2,0xff,4);
  auVar2 = vpinsrw_avx(auVar2,0xff,5);
  auVar2 = vpinsrw_avx(auVar2,0xff,6);
  auVar2 = vpinsrw_avx(auVar2,0xff,7);
  uStack_2f0 = auVar2._0_8_;
  uStack_2e8 = auVar2._8_8_;
  uVar130 = *in_stack_00000008;
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar6 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_2b0 = auVar2._0_8_;
  uStack_2a8 = auVar2._8_8_;
  uVar130 = in_stack_00000008[4];
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar7 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_270 = auVar2._0_8_;
  uStack_268 = auVar2._8_8_;
  uVar130 = in_stack_00000008[8];
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar8 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_230 = auVar2._0_8_;
  uStack_228 = auVar2._8_8_;
  uVar130 = in_stack_00000008[0xc];
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar9 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  uVar130 = in_stack_00000008[0x10];
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar10 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_1b0 = auVar2._0_8_;
  uStack_1a8 = auVar2._8_8_;
  uVar130 = in_stack_00000008[0x14];
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar11 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_170 = auVar2._0_8_;
  uStack_168 = auVar2._8_8_;
  uVar130 = in_stack_00000008[0x18];
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar12 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_130 = auVar2._0_8_;
  uStack_128 = auVar2._8_8_;
  uVar130 = in_stack_00000008[0x1c];
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar13 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  auVar2 = vpinsrw_avx(ZEXT216(uVar130),(uint)uVar130,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar130,7);
  uStack_f0 = auVar2._0_8_;
  uStack_e8 = auVar2._8_8_;
  uVar1 = *(uint *)(in_stack_00000008 + 0x20);
  auVar2 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar2 = vpinsrd_avx(auVar2,uVar1,2);
  auVar2 = vpinsrd_avx(auVar2,uVar1,3);
  auVar133 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar133 = vpinsrd_avx(auVar133,uVar1,2);
  auVar133 = vpinsrd_avx(auVar133,uVar1,3);
  uStack_b0 = auVar133._0_8_;
  uStack_a8 = auVar133._8_8_;
  auVar133 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar133 = vpinsrd_avx(auVar133,0x20,2);
  auVar133 = vpinsrd_avx(auVar133,0x20,3);
  auVar132 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar132 = vpinsrd_avx(auVar132,0x20,2);
  auVar132 = vpinsrd_avx(auVar132,0x20,3);
  auVar132 = ZEXT116(0) * auVar133 + ZEXT116(1) * auVar132;
  auVar133 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar133;
  uStack_70 = auVar133._0_8_;
  uStack_68 = auVar133._8_8_;
  local_3988 = in_RDX;
  local_3978 = in_RDI;
  for (local_4664 = 0; local_4664 < in_R9D; local_4664 = local_4664 + 1) {
    local_39a0 = (undefined1 (*) [32])(*local_3988 + in_ECX);
    local_39a8 = (undefined1 (*) [32])((long)local_3988 - (long)in_ECX);
    local_39b0 = (undefined1 (*) [32])(*local_3988 + (in_ECX << 1));
    local_39b8 = (undefined1 (*) [32])((long)local_3988 - (long)(in_ECX << 1));
    local_39c0 = (undefined1 (*) [32])(*local_3988 + in_ECX * 3);
    local_39c8 = (undefined1 (*) [32])((long)local_3988 - (long)(in_ECX * 3));
    if (local_4664 < 3) {
      if (local_4664 == 0) {
        local_39a8 = local_3988;
        local_39b8 = local_3988;
      }
      else if (local_4664 == 1) {
        local_39b8 = local_39a8;
      }
      local_39c8 = local_39b8;
    }
    else if (in_R9D + -4 < local_4664) {
      if (local_4664 == in_R9D + -1) {
        local_39a0 = local_3988;
        local_39b0 = local_3988;
      }
      else if (local_4664 == in_R9D + -2) {
        local_39b0 = local_39a0;
      }
      local_39c0 = local_39b0;
    }
    if (in_R8D < 0x11) {
      auVar96._16_8_ = uStack_2f0;
      auVar96._0_16_ = auVar5;
      auVar96._24_8_ = uStack_2e8;
      auVar14 = vpand_avx2(*local_39c8,auVar96);
      auVar95._16_8_ = uStack_2f0;
      auVar95._0_16_ = auVar5;
      auVar95._24_8_ = uStack_2e8;
      auVar15 = vpand_avx2(*local_39c0,auVar95);
      auVar14 = vpaddw_avx2(auVar14,auVar15);
      auVar126._16_8_ = uStack_2b0;
      auVar126._0_16_ = auVar6;
      auVar126._24_8_ = uStack_2a8;
      auVar21 = vpmullw_avx2(auVar126,auVar14);
      auVar94._16_8_ = uStack_2f0;
      auVar94._0_16_ = auVar5;
      auVar94._24_8_ = uStack_2e8;
      auVar14 = vpand_avx2(*local_39b8,auVar94);
      auVar93._16_8_ = uStack_2f0;
      auVar93._0_16_ = auVar5;
      auVar93._24_8_ = uStack_2e8;
      auVar15 = vpand_avx2(*local_39b0,auVar93);
      auVar14 = vpaddw_avx2(auVar14,auVar15);
      auVar125._16_8_ = uStack_270;
      auVar125._0_16_ = auVar7;
      auVar125._24_8_ = uStack_268;
      auVar22 = vpmullw_avx2(auVar125,auVar14);
      auVar92._16_8_ = uStack_2f0;
      auVar92._0_16_ = auVar5;
      auVar92._24_8_ = uStack_2e8;
      auVar14 = vpand_avx2(*(undefined1 (*) [32])(local_39a8[-1] + 0x1e),auVar92);
      auVar91._16_8_ = uStack_2f0;
      auVar91._0_16_ = auVar5;
      auVar91._24_8_ = uStack_2e8;
      auVar15 = vpand_avx2(*local_39a8,auVar91);
      auVar90._16_8_ = uStack_2f0;
      auVar90._0_16_ = auVar5;
      auVar90._24_8_ = uStack_2e8;
      auVar16 = vpand_avx2(*(undefined1 (*) [32])(*local_39a8 + 2),auVar90);
      auVar89._16_8_ = uStack_2f0;
      auVar89._0_16_ = auVar5;
      auVar89._24_8_ = uStack_2e8;
      auVar17 = vpand_avx2(*(undefined1 (*) [32])(local_39a0[-1] + 0x1e),auVar89);
      auVar88._16_8_ = uStack_2f0;
      auVar88._0_16_ = auVar5;
      auVar88._24_8_ = uStack_2e8;
      auVar18 = vpand_avx2(*local_39a0,auVar88);
      auVar87._16_8_ = uStack_2f0;
      auVar87._0_16_ = auVar5;
      auVar87._24_8_ = uStack_2e8;
      auVar19 = vpand_avx2(*(undefined1 (*) [32])(*local_39a0 + 2),auVar87);
      auVar14 = vpaddw_avx2(auVar14,auVar19);
      auVar15 = vpaddw_avx2(auVar15,auVar18);
      auVar16 = vpaddw_avx2(auVar16,auVar17);
      auVar124._16_8_ = uStack_230;
      auVar124._0_16_ = auVar8;
      auVar124._24_8_ = uStack_228;
      auVar23 = vpmullw_avx2(auVar14,auVar124);
      auVar123._16_8_ = uStack_1f0;
      auVar123._0_16_ = auVar9;
      auVar123._24_8_ = uStack_1e8;
      auVar24 = vpmullw_avx2(auVar15,auVar123);
      auVar122._16_8_ = uStack_1b0;
      auVar122._0_16_ = auVar10;
      auVar122._24_8_ = uStack_1a8;
      auVar25 = vpmullw_avx2(auVar16,auVar122);
      auVar86._16_8_ = uStack_2f0;
      auVar86._0_16_ = auVar5;
      auVar86._24_8_ = uStack_2e8;
      auVar14 = vpand_avx2(*(undefined1 (*) [32])(local_3988[-1] + 0x1a),auVar86);
      auVar85._16_8_ = uStack_2f0;
      auVar85._0_16_ = auVar5;
      auVar85._24_8_ = uStack_2e8;
      auVar15 = vpand_avx2(*(undefined1 (*) [32])(local_3988[-1] + 0x1c),auVar85);
      auVar84._16_8_ = uStack_2f0;
      auVar84._0_16_ = auVar5;
      auVar84._24_8_ = uStack_2e8;
      auVar16 = vpand_avx2(*(undefined1 (*) [32])(local_3988[-1] + 0x1e),auVar84);
      auVar83._16_8_ = uStack_2f0;
      auVar83._0_16_ = auVar5;
      auVar83._24_8_ = uStack_2e8;
      auVar17 = vpand_avx2(*local_3988,auVar83);
      auVar82._16_8_ = uStack_2f0;
      auVar82._0_16_ = auVar5;
      auVar82._24_8_ = uStack_2e8;
      auVar18 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + 2),auVar82);
      auVar81._16_8_ = uStack_2f0;
      auVar81._0_16_ = auVar5;
      auVar81._24_8_ = uStack_2e8;
      auVar19 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + 4),auVar81);
      auVar80._16_8_ = uStack_2f0;
      auVar80._0_16_ = auVar5;
      auVar80._24_8_ = uStack_2e8;
      auVar20 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + 6),auVar80);
      auVar14 = vpaddw_avx2(auVar14,auVar20);
      auVar15 = vpaddw_avx2(auVar15,auVar19);
      auVar16 = vpaddw_avx2(auVar16,auVar18);
      auVar121._16_8_ = uStack_170;
      auVar121._0_16_ = auVar11;
      auVar121._24_8_ = uStack_168;
      auVar26 = vpmullw_avx2(auVar14,auVar121);
      auVar120._16_8_ = uStack_130;
      auVar120._0_16_ = auVar12;
      auVar120._24_8_ = uStack_128;
      auVar27 = vpmullw_avx2(auVar15,auVar120);
      auVar119._16_8_ = uStack_f0;
      auVar119._0_16_ = auVar13;
      auVar119._24_8_ = uStack_e8;
      auVar28 = vpmullw_avx2(auVar16,auVar119);
      auVar14 = vpmovsxwd_avx2(auVar17._0_16_);
      auVar15 = vpmovsxwd_avx2(local_3100);
      auVar118._16_8_ = uStack_b0;
      auVar118._0_16_ = auVar2;
      auVar118._24_8_ = uStack_a8;
      auVar29 = vpmullw_avx2(auVar14,auVar118);
      auVar117._16_8_ = uStack_b0;
      auVar117._0_16_ = auVar2;
      auVar117._24_8_ = uStack_a8;
      auVar30 = vpmullw_avx2(auVar15,auVar117);
      auVar14 = vpmovsxwd_avx2(auVar21._0_16_);
      auVar15 = vpmovsxwd_avx2(auVar22._0_16_);
      auVar16 = vpmovsxwd_avx2(auVar23._0_16_);
      auVar17 = vpmovsxwd_avx2(auVar24._0_16_);
      auVar18 = vpmovsxwd_avx2(auVar25._0_16_);
      auVar19 = vpmovsxwd_avx2(auVar26._0_16_);
      auVar20 = vpmovsxwd_avx2(auVar27._0_16_);
      auVar21 = vpmovsxwd_avx2(auVar28._0_16_);
      auVar14 = vpaddd_avx2(auVar14,auVar15);
      auVar15 = vpaddd_avx2(auVar16,auVar17);
      auVar16 = vpaddd_avx2(auVar18,auVar19);
      auVar17 = vpaddd_avx2(auVar20,auVar21);
      auVar14 = vpaddd_avx2(auVar14,auVar15);
      auVar15 = vpaddd_avx2(auVar16,auVar17);
      auVar14 = vpaddd_avx2(auVar14,auVar15);
      auVar14 = vpaddd_avx2(auVar14,auVar29);
      auVar61._8_8_ = uStack_3188;
      auVar61._0_8_ = local_3190;
      auVar15 = vpmovsxwd_avx2(auVar61);
      uStack_4268 = auVar22._24_8_;
      uStack_3188 = uStack_4268;
      uStack_4270 = auVar22._16_8_;
      local_3190 = uStack_4270;
      auVar60._8_8_ = uStack_3198;
      auVar60._0_8_ = local_31a0;
      auVar16 = vpmovsxwd_avx2(auVar60);
      uStack_42c8 = auVar23._24_8_;
      uStack_3198 = uStack_42c8;
      uStack_42d0 = auVar23._16_8_;
      local_31a0 = uStack_42d0;
      auVar59._8_8_ = uStack_31a8;
      auVar59._0_8_ = local_31b0;
      auVar17 = vpmovsxwd_avx2(auVar59);
      uStack_4328 = auVar24._24_8_;
      uStack_31a8 = uStack_4328;
      uStack_4330 = auVar24._16_8_;
      local_31b0 = uStack_4330;
      auVar58._8_8_ = uStack_31b8;
      auVar58._0_8_ = local_31c0;
      auVar18 = vpmovsxwd_avx2(auVar58);
      uStack_4388 = auVar25._24_8_;
      uStack_31b8 = uStack_4388;
      uStack_4390 = auVar25._16_8_;
      local_31c0 = uStack_4390;
      auVar57._8_8_ = uStack_31c8;
      auVar57._0_8_ = local_31d0;
      auVar19 = vpmovsxwd_avx2(auVar57);
      uStack_43e8 = auVar26._24_8_;
      uStack_31c8 = uStack_43e8;
      uStack_43f0 = auVar26._16_8_;
      local_31d0 = uStack_43f0;
      auVar56._8_8_ = uStack_31d8;
      auVar56._0_8_ = local_31e0;
      auVar20 = vpmovsxwd_avx2(auVar56);
      uStack_4468 = auVar27._24_8_;
      uStack_31d8 = uStack_4468;
      uStack_4470 = auVar27._16_8_;
      local_31e0 = uStack_4470;
      auVar55._8_8_ = uStack_31e8;
      auVar55._0_8_ = local_31f0;
      auVar21 = vpmovsxwd_avx2(auVar55);
      uStack_44a8 = auVar28._24_8_;
      uStack_31e8 = uStack_44a8;
      uStack_44b0 = auVar28._16_8_;
      local_31f0 = uStack_44b0;
      auVar22 = vpmovsxwd_avx2(local_3200);
      auVar15 = vpaddd_avx2(auVar15,auVar16);
      auVar16 = vpaddd_avx2(auVar17,auVar18);
      auVar17 = vpaddd_avx2(auVar19,auVar20);
      auVar18 = vpaddd_avx2(auVar21,auVar22);
      auVar15 = vpaddd_avx2(auVar15,auVar16);
      auVar16 = vpaddd_avx2(auVar17,auVar18);
      auVar15 = vpaddd_avx2(auVar15,auVar16);
      auVar15 = vpaddd_avx2(auVar15,auVar30);
      auVar63._16_8_ = uStack_70;
      auVar63._0_16_ = auVar132;
      auVar63._24_8_ = uStack_68;
      auVar14 = vpaddd_avx2(auVar14,auVar63);
      auVar62._16_8_ = uStack_70;
      auVar62._0_16_ = auVar132;
      auVar62._24_8_ = uStack_68;
      auVar15 = vpaddd_avx2(auVar15,auVar62);
      auVar14 = vpsrad_avx2(auVar14,ZEXT416(6));
      auVar15 = vpsrad_avx2(auVar15,ZEXT416(6));
      auVar14 = vpackssdw_avx2(auVar14,auVar15);
      auVar14 = vpermq_avx2(auVar14,0xd8);
      auVar64._16_8_ = uStack_330;
      auVar64._0_16_ = auVar4;
      auVar64._24_8_ = uStack_328;
      auVar14 = vpminsw_avx2(auVar14,auVar64);
      auVar65._16_8_ = uStack_370;
      auVar65._0_16_ = auVar3;
      auVar65._24_8_ = uStack_368;
      auVar14 = vpmaxsw_avx2(auVar14,auVar65);
      auVar129._16_8_ = uStack_2f0;
      auVar129._0_16_ = auVar5;
      auVar129._24_8_ = uStack_2e8;
      auVar14 = vpblendvb_avx2(*local_3978,auVar14,auVar129);
      local_3a00 = auVar14._0_8_;
      uStack_39f8 = auVar14._8_8_;
      uStack_39f0 = auVar14._16_8_;
      uStack_39e8 = auVar14._24_8_;
      *(undefined8 *)*local_3978 = local_3a00;
      *(undefined8 *)(*local_3978 + 8) = uStack_39f8;
      *(undefined8 *)(*local_3978 + 0x10) = uStack_39f0;
      *(undefined8 *)(*local_3978 + 0x18) = uStack_39e8;
    }
    else {
      for (local_4668 = 0; SBORROW4(local_4668,in_R8D * 2) != local_4668 + in_R8D * -2 < 0;
          local_4668 = local_4668 + 0x40) {
        auVar79._16_8_ = uStack_2f0;
        auVar79._0_16_ = auVar5;
        auVar79._24_8_ = uStack_2e8;
        auVar14 = vpand_avx2(*(undefined1 (*) [32])(*local_39c8 + local_4668),auVar79);
        auVar78._16_8_ = uStack_2f0;
        auVar78._0_16_ = auVar5;
        auVar78._24_8_ = uStack_2e8;
        auVar15 = vpand_avx2(*(undefined1 (*) [32])(local_39c8[1] + local_4668),auVar78);
        auVar29._16_8_ = uStack_2f0;
        auVar29._0_16_ = auVar5;
        auVar29._24_8_ = uStack_2e8;
        auVar16 = vpand_avx2(*(undefined1 (*) [32])(*local_39c0 + local_4668),auVar29);
        auVar28._16_8_ = uStack_2f0;
        auVar28._0_16_ = auVar5;
        auVar28._24_8_ = uStack_2e8;
        auVar17 = vpand_avx2(*(undefined1 (*) [32])(local_39c0[1] + local_4668),auVar28);
        auVar14 = vpaddw_avx2(auVar14,auVar16);
        auVar15 = vpaddw_avx2(auVar15,auVar17);
        auVar116._16_8_ = uStack_2b0;
        auVar116._0_16_ = auVar6;
        auVar116._24_8_ = uStack_2a8;
        auVar28 = vpmullw_avx2(auVar116,auVar14);
        auVar115._16_8_ = uStack_2b0;
        auVar115._0_16_ = auVar6;
        auVar115._24_8_ = uStack_2a8;
        auVar29 = vpmullw_avx2(auVar115,auVar15);
        auVar77._16_8_ = uStack_2f0;
        auVar77._0_16_ = auVar5;
        auVar77._24_8_ = uStack_2e8;
        auVar14 = vpand_avx2(*(undefined1 (*) [32])(*local_39b8 + local_4668),auVar77);
        auVar76._16_8_ = uStack_2f0;
        auVar76._0_16_ = auVar5;
        auVar76._24_8_ = uStack_2e8;
        auVar15 = vpand_avx2(*(undefined1 (*) [32])(local_39b8[1] + local_4668),auVar76);
        auVar31._16_8_ = uStack_2f0;
        auVar31._0_16_ = auVar5;
        auVar31._24_8_ = uStack_2e8;
        auVar16 = vpand_avx2(*(undefined1 (*) [32])(*local_39b0 + local_4668),auVar31);
        auVar30._16_8_ = uStack_2f0;
        auVar30._0_16_ = auVar5;
        auVar30._24_8_ = uStack_2e8;
        auVar17 = vpand_avx2(*(undefined1 (*) [32])(local_39b0[1] + local_4668),auVar30);
        auVar14 = vpaddw_avx2(auVar14,auVar16);
        auVar15 = vpaddw_avx2(auVar15,auVar17);
        auVar114._16_8_ = uStack_270;
        auVar114._0_16_ = auVar7;
        auVar114._24_8_ = uStack_268;
        auVar30 = vpmullw_avx2(auVar114,auVar14);
        auVar113._16_8_ = uStack_270;
        auVar113._0_16_ = auVar7;
        auVar113._24_8_ = uStack_268;
        auVar31 = vpmullw_avx2(auVar113,auVar15);
        auVar75._16_8_ = uStack_2f0;
        auVar75._0_16_ = auVar5;
        auVar75._24_8_ = uStack_2e8;
        auVar14 = vpand_avx2(*(undefined1 (*) [32])(*local_39a8 + (local_4668 + -2)),auVar75);
        auVar74._16_8_ = uStack_2f0;
        auVar74._0_16_ = auVar5;
        auVar74._24_8_ = uStack_2e8;
        auVar15 = vpand_avx2(*(undefined1 (*) [32])(*local_39a8 + (long)local_4668 + 0x1e),auVar74);
        auVar73._16_8_ = uStack_2f0;
        auVar73._0_16_ = auVar5;
        auVar73._24_8_ = uStack_2e8;
        auVar16 = vpand_avx2(*(undefined1 (*) [32])(*local_39a8 + local_4668),auVar73);
        auVar72._16_8_ = uStack_2f0;
        auVar72._0_16_ = auVar5;
        auVar72._24_8_ = uStack_2e8;
        auVar17 = vpand_avx2(*(undefined1 (*) [32])(local_39a8[1] + local_4668),auVar72);
        auVar71._16_8_ = uStack_2f0;
        auVar71._0_16_ = auVar5;
        auVar71._24_8_ = uStack_2e8;
        auVar18 = vpand_avx2(*(undefined1 (*) [32])(*local_39a8 + (long)local_4668 + 2),auVar71);
        auVar70._16_8_ = uStack_2f0;
        auVar70._0_16_ = auVar5;
        auVar70._24_8_ = uStack_2e8;
        auVar19 = vpand_avx2(*(undefined1 (*) [32])(local_39a8[1] + (long)local_4668 + 2),auVar70);
        auVar37._16_8_ = uStack_2f0;
        auVar37._0_16_ = auVar5;
        auVar37._24_8_ = uStack_2e8;
        auVar20 = vpand_avx2(*(undefined1 (*) [32])(*local_39a0 + (local_4668 + -2)),auVar37);
        auVar36._16_8_ = uStack_2f0;
        auVar36._0_16_ = auVar5;
        auVar36._24_8_ = uStack_2e8;
        auVar21 = vpand_avx2(*(undefined1 (*) [32])(*local_39a0 + (long)local_4668 + 0x1e),auVar36);
        auVar35._16_8_ = uStack_2f0;
        auVar35._0_16_ = auVar5;
        auVar35._24_8_ = uStack_2e8;
        auVar22 = vpand_avx2(*(undefined1 (*) [32])(*local_39a0 + local_4668),auVar35);
        auVar34._16_8_ = uStack_2f0;
        auVar34._0_16_ = auVar5;
        auVar34._24_8_ = uStack_2e8;
        auVar23 = vpand_avx2(*(undefined1 (*) [32])(local_39a0[1] + local_4668),auVar34);
        auVar33._16_8_ = uStack_2f0;
        auVar33._0_16_ = auVar5;
        auVar33._24_8_ = uStack_2e8;
        auVar24 = vpand_avx2(*(undefined1 (*) [32])(*local_39a0 + (long)local_4668 + 2),auVar33);
        auVar32._16_8_ = uStack_2f0;
        auVar32._0_16_ = auVar5;
        auVar32._24_8_ = uStack_2e8;
        auVar25 = vpand_avx2(*(undefined1 (*) [32])(local_39a0[1] + (long)local_4668 + 2),auVar32);
        auVar14 = vpaddw_avx2(auVar14,auVar24);
        auVar15 = vpaddw_avx2(auVar15,auVar25);
        auVar16 = vpaddw_avx2(auVar16,auVar22);
        auVar17 = vpaddw_avx2(auVar17,auVar23);
        auVar18 = vpaddw_avx2(auVar18,auVar20);
        auVar19 = vpaddw_avx2(auVar19,auVar21);
        auVar112._16_8_ = uStack_230;
        auVar112._0_16_ = auVar8;
        auVar112._24_8_ = uStack_228;
        auVar32 = vpmullw_avx2(auVar14,auVar112);
        auVar111._16_8_ = uStack_230;
        auVar111._0_16_ = auVar8;
        auVar111._24_8_ = uStack_228;
        auVar33 = vpmullw_avx2(auVar15,auVar111);
        auVar110._16_8_ = uStack_1f0;
        auVar110._0_16_ = auVar9;
        auVar110._24_8_ = uStack_1e8;
        auVar34 = vpmullw_avx2(auVar16,auVar110);
        auVar109._16_8_ = uStack_1f0;
        auVar109._0_16_ = auVar9;
        auVar109._24_8_ = uStack_1e8;
        auVar35 = vpmullw_avx2(auVar17,auVar109);
        auVar108._16_8_ = uStack_1b0;
        auVar108._0_16_ = auVar10;
        auVar108._24_8_ = uStack_1a8;
        auVar36 = vpmullw_avx2(auVar18,auVar108);
        auVar107._16_8_ = uStack_1b0;
        auVar107._0_16_ = auVar10;
        auVar107._24_8_ = uStack_1a8;
        auVar37 = vpmullw_avx2(auVar19,auVar107);
        auVar14._16_8_ = uStack_2f0;
        auVar14._0_16_ = auVar5;
        auVar14._24_8_ = uStack_2e8;
        auVar14 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (local_4668 + -6)),auVar14);
        auVar15._16_8_ = uStack_2f0;
        auVar15._0_16_ = auVar5;
        auVar15._24_8_ = uStack_2e8;
        auVar15 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (long)local_4668 + 0x1a),auVar15);
        auVar69._16_8_ = uStack_2f0;
        auVar69._0_16_ = auVar5;
        auVar69._24_8_ = uStack_2e8;
        auVar16 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (local_4668 + -4)),auVar69);
        auVar68._16_8_ = uStack_2f0;
        auVar68._0_16_ = auVar5;
        auVar68._24_8_ = uStack_2e8;
        auVar17 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (long)local_4668 + 0x1c),auVar68);
        auVar67._16_8_ = uStack_2f0;
        auVar67._0_16_ = auVar5;
        auVar67._24_8_ = uStack_2e8;
        auVar18 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (local_4668 + -2)),auVar67);
        auVar66._16_8_ = uStack_2f0;
        auVar66._0_16_ = auVar5;
        auVar66._24_8_ = uStack_2e8;
        auVar19 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (long)local_4668 + 0x1e),auVar66);
        auVar41._16_8_ = uStack_2f0;
        auVar41._0_16_ = auVar5;
        auVar41._24_8_ = uStack_2e8;
        auVar20 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + local_4668),auVar41);
        auVar40._16_8_ = uStack_2f0;
        auVar40._0_16_ = auVar5;
        auVar40._24_8_ = uStack_2e8;
        auVar21 = vpand_avx2(*(undefined1 (*) [32])(local_3988[1] + local_4668),auVar40);
        auVar39._16_8_ = uStack_2f0;
        auVar39._0_16_ = auVar5;
        auVar39._24_8_ = uStack_2e8;
        auVar22 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (long)local_4668 + 2),auVar39);
        auVar38._16_8_ = uStack_2f0;
        auVar38._0_16_ = auVar5;
        auVar38._24_8_ = uStack_2e8;
        auVar23 = vpand_avx2(*(undefined1 (*) [32])(local_3988[1] + (long)local_4668 + 2),auVar38);
        auVar24._16_8_ = uStack_2f0;
        auVar24._0_16_ = auVar5;
        auVar24._24_8_ = uStack_2e8;
        auVar24 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (long)local_4668 + 4),auVar24);
        auVar25._16_8_ = uStack_2f0;
        auVar25._0_16_ = auVar5;
        auVar25._24_8_ = uStack_2e8;
        auVar25 = vpand_avx2(*(undefined1 (*) [32])(local_3988[1] + (long)local_4668 + 4),auVar25);
        auVar26._16_8_ = uStack_2f0;
        auVar26._0_16_ = auVar5;
        auVar26._24_8_ = uStack_2e8;
        auVar26 = vpand_avx2(*(undefined1 (*) [32])(*local_3988 + (long)local_4668 + 6),auVar26);
        auVar27._16_8_ = uStack_2f0;
        auVar27._0_16_ = auVar5;
        auVar27._24_8_ = uStack_2e8;
        auVar27 = vpand_avx2(*(undefined1 (*) [32])(local_3988[1] + (long)local_4668 + 6),auVar27);
        auVar14 = vpaddw_avx2(auVar14,auVar26);
        auVar15 = vpaddw_avx2(auVar15,auVar27);
        auVar16 = vpaddw_avx2(auVar16,auVar24);
        auVar17 = vpaddw_avx2(auVar17,auVar25);
        auVar18 = vpaddw_avx2(auVar18,auVar22);
        auVar19 = vpaddw_avx2(auVar19,auVar23);
        auVar106._16_8_ = uStack_170;
        auVar106._0_16_ = auVar11;
        auVar106._24_8_ = uStack_168;
        auVar22 = vpmullw_avx2(auVar14,auVar106);
        auVar105._16_8_ = uStack_170;
        auVar105._0_16_ = auVar11;
        auVar105._24_8_ = uStack_168;
        auVar24 = vpmullw_avx2(auVar15,auVar105);
        auVar104._16_8_ = uStack_130;
        auVar104._0_16_ = auVar12;
        auVar104._24_8_ = uStack_128;
        auVar23 = vpmullw_avx2(auVar16,auVar104);
        auVar103._16_8_ = uStack_130;
        auVar103._0_16_ = auVar12;
        auVar103._24_8_ = uStack_128;
        auVar25 = vpmullw_avx2(auVar17,auVar103);
        auVar102._16_8_ = uStack_f0;
        auVar102._0_16_ = auVar13;
        auVar102._24_8_ = uStack_e8;
        auVar26 = vpmullw_avx2(auVar18,auVar102);
        auVar101._16_8_ = uStack_f0;
        auVar101._0_16_ = auVar13;
        auVar101._24_8_ = uStack_e8;
        auVar27 = vpmullw_avx2(auVar19,auVar101);
        auVar14 = vpmovsxwd_avx2(auVar20._0_16_);
        auVar15 = vpmovsxwd_avx2(local_3220);
        auVar16 = vpmovsxwd_avx2(auVar21._0_16_);
        auVar17 = vpmovsxwd_avx2(local_3240);
        auVar100._16_8_ = uStack_b0;
        auVar100._0_16_ = auVar2;
        auVar100._24_8_ = uStack_a8;
        auVar38 = vpmullw_avx2(auVar14,auVar100);
        auVar99._16_8_ = uStack_b0;
        auVar99._0_16_ = auVar2;
        auVar99._24_8_ = uStack_a8;
        auVar39 = vpmullw_avx2(auVar15,auVar99);
        auVar98._16_8_ = uStack_b0;
        auVar98._0_16_ = auVar2;
        auVar98._24_8_ = uStack_a8;
        auVar40 = vpmullw_avx2(auVar16,auVar98);
        auVar97._16_8_ = uStack_b0;
        auVar97._0_16_ = auVar2;
        auVar97._24_8_ = uStack_a8;
        auVar41 = vpmullw_avx2(auVar17,auVar97);
        auVar14 = vpmovsxwd_avx2(auVar28._0_16_);
        auVar15 = vpmovsxwd_avx2(auVar30._0_16_);
        auVar16 = vpmovsxwd_avx2(auVar32._0_16_);
        auVar17 = vpmovsxwd_avx2(auVar34._0_16_);
        auVar18 = vpmovsxwd_avx2(auVar36._0_16_);
        auVar19 = vpmovsxwd_avx2(auVar22._0_16_);
        auVar20 = vpmovsxwd_avx2(auVar23._0_16_);
        auVar21 = vpmovsxwd_avx2(auVar26._0_16_);
        auVar14 = vpaddd_avx2(auVar14,auVar15);
        auVar15 = vpaddd_avx2(auVar16,auVar17);
        auVar16 = vpaddd_avx2(auVar18,auVar19);
        auVar17 = vpaddd_avx2(auVar20,auVar21);
        auVar14 = vpaddd_avx2(auVar14,auVar15);
        auVar15 = vpaddd_avx2(auVar16,auVar17);
        auVar14 = vpaddd_avx2(auVar14,auVar15);
        auVar14 = vpaddd_avx2(auVar14,auVar38);
        auVar54._8_8_ = uStack_32c8;
        auVar54._0_8_ = local_32d0;
        auVar15 = vpmovsxwd_avx2(auVar54);
        uStack_4268 = auVar30._24_8_;
        uStack_32c8 = uStack_4268;
        uStack_4270 = auVar30._16_8_;
        local_32d0 = uStack_4270;
        auVar53._8_8_ = uStack_32d8;
        auVar53._0_8_ = local_32e0;
        auVar16 = vpmovsxwd_avx2(auVar53);
        uStack_42c8 = auVar32._24_8_;
        uStack_32d8 = uStack_42c8;
        uStack_42d0 = auVar32._16_8_;
        local_32e0 = uStack_42d0;
        auVar52._8_8_ = uStack_32e8;
        auVar52._0_8_ = local_32f0;
        auVar17 = vpmovsxwd_avx2(auVar52);
        uStack_4328 = auVar34._24_8_;
        uStack_32e8 = uStack_4328;
        uStack_4330 = auVar34._16_8_;
        local_32f0 = uStack_4330;
        auVar51._8_8_ = uStack_32f8;
        auVar51._0_8_ = local_3300;
        auVar18 = vpmovsxwd_avx2(auVar51);
        uStack_4388 = auVar36._24_8_;
        uStack_32f8 = uStack_4388;
        uStack_4390 = auVar36._16_8_;
        local_3300 = uStack_4390;
        auVar50._8_8_ = uStack_3308;
        auVar50._0_8_ = local_3310;
        auVar19 = vpmovsxwd_avx2(auVar50);
        uStack_43e8 = auVar22._24_8_;
        uStack_3308 = uStack_43e8;
        uStack_43f0 = auVar22._16_8_;
        local_3310 = uStack_43f0;
        auVar49._8_8_ = uStack_3318;
        auVar49._0_8_ = local_3320;
        auVar20 = vpmovsxwd_avx2(auVar49);
        uStack_4468 = auVar23._24_8_;
        uStack_3318 = uStack_4468;
        uStack_4470 = auVar23._16_8_;
        local_3320 = uStack_4470;
        auVar48._8_8_ = uStack_3328;
        auVar48._0_8_ = local_3330;
        auVar21 = vpmovsxwd_avx2(auVar48);
        uStack_44a8 = auVar26._24_8_;
        uStack_3328 = uStack_44a8;
        uStack_44b0 = auVar26._16_8_;
        local_3330 = uStack_44b0;
        auVar22 = vpmovsxwd_avx2(local_3340);
        auVar15 = vpaddd_avx2(auVar15,auVar16);
        auVar16 = vpaddd_avx2(auVar17,auVar18);
        auVar17 = vpaddd_avx2(auVar19,auVar20);
        auVar18 = vpaddd_avx2(auVar21,auVar22);
        auVar15 = vpaddd_avx2(auVar15,auVar16);
        auVar16 = vpaddd_avx2(auVar17,auVar18);
        auVar15 = vpaddd_avx2(auVar15,auVar16);
        auVar15 = vpaddd_avx2(auVar15,auVar39);
        auVar16 = vpmovsxwd_avx2(auVar29._0_16_);
        auVar17 = vpmovsxwd_avx2(auVar31._0_16_);
        auVar18 = vpmovsxwd_avx2(auVar33._0_16_);
        auVar19 = vpmovsxwd_avx2(auVar35._0_16_);
        auVar20 = vpmovsxwd_avx2(auVar37._0_16_);
        auVar21 = vpmovsxwd_avx2(auVar24._0_16_);
        auVar22 = vpmovsxwd_avx2(auVar25._0_16_);
        auVar23 = vpmovsxwd_avx2(auVar27._0_16_);
        auVar16 = vpaddd_avx2(auVar16,auVar17);
        auVar17 = vpaddd_avx2(auVar18,auVar19);
        auVar18 = vpaddd_avx2(auVar20,auVar21);
        auVar19 = vpaddd_avx2(auVar22,auVar23);
        auVar16 = vpaddd_avx2(auVar16,auVar17);
        auVar17 = vpaddd_avx2(auVar18,auVar19);
        auVar16 = vpaddd_avx2(auVar16,auVar17);
        auVar16 = vpaddd_avx2(auVar16,auVar40);
        auVar47._8_8_ = uStack_33c8;
        auVar47._0_8_ = local_33d0;
        auVar17 = vpmovsxwd_avx2(auVar47);
        uStack_4288 = auVar31._24_8_;
        uStack_33c8 = uStack_4288;
        uStack_4290 = auVar31._16_8_;
        local_33d0 = uStack_4290;
        auVar46._8_8_ = uStack_33d8;
        auVar46._0_8_ = local_33e0;
        auVar18 = vpmovsxwd_avx2(auVar46);
        uStack_42e8 = auVar33._24_8_;
        uStack_33d8 = uStack_42e8;
        uStack_42f0 = auVar33._16_8_;
        local_33e0 = uStack_42f0;
        auVar45._8_8_ = uStack_33e8;
        auVar45._0_8_ = local_33f0;
        auVar19 = vpmovsxwd_avx2(auVar45);
        uStack_4348 = auVar35._24_8_;
        uStack_33e8 = uStack_4348;
        uStack_4350 = auVar35._16_8_;
        local_33f0 = uStack_4350;
        auVar44._8_8_ = uStack_33f8;
        auVar44._0_8_ = local_3400;
        auVar20 = vpmovsxwd_avx2(auVar44);
        uStack_43a8 = auVar37._24_8_;
        uStack_33f8 = uStack_43a8;
        uStack_43b0 = auVar37._16_8_;
        local_3400 = uStack_43b0;
        auVar43._8_8_ = uStack_3408;
        auVar43._0_8_ = local_3410;
        auVar21 = vpmovsxwd_avx2(auVar43);
        uStack_4408 = auVar24._24_8_;
        uStack_3408 = uStack_4408;
        uStack_4410 = auVar24._16_8_;
        local_3410 = uStack_4410;
        auVar42._8_8_ = uStack_3418;
        auVar42._0_8_ = local_3420;
        auVar22 = vpmovsxwd_avx2(auVar42);
        uStack_4488 = auVar25._24_8_;
        uStack_3418 = uStack_4488;
        uStack_4490 = auVar25._16_8_;
        local_3420 = uStack_4490;
        auVar133._8_8_ = uStack_3428;
        auVar133._0_8_ = local_3430;
        auVar23 = vpmovsxwd_avx2(auVar133);
        uStack_44c8 = auVar27._24_8_;
        uStack_3428 = uStack_44c8;
        uStack_44d0 = auVar27._16_8_;
        local_3430 = uStack_44d0;
        auVar24 = vpmovsxwd_avx2(local_3440);
        auVar17 = vpaddd_avx2(auVar17,auVar18);
        auVar18 = vpaddd_avx2(auVar19,auVar20);
        auVar19 = vpaddd_avx2(auVar21,auVar22);
        auVar20 = vpaddd_avx2(auVar23,auVar24);
        auVar17 = vpaddd_avx2(auVar17,auVar18);
        auVar18 = vpaddd_avx2(auVar19,auVar20);
        auVar17 = vpaddd_avx2(auVar17,auVar18);
        auVar17 = vpaddd_avx2(auVar17,auVar41);
        auVar21._16_8_ = uStack_70;
        auVar21._0_16_ = auVar132;
        auVar21._24_8_ = uStack_68;
        auVar14 = vpaddd_avx2(auVar14,auVar21);
        auVar20._16_8_ = uStack_70;
        auVar20._0_16_ = auVar132;
        auVar20._24_8_ = uStack_68;
        auVar15 = vpaddd_avx2(auVar15,auVar20);
        auVar19._16_8_ = uStack_70;
        auVar19._0_16_ = auVar132;
        auVar19._24_8_ = uStack_68;
        auVar16 = vpaddd_avx2(auVar16,auVar19);
        auVar18._16_8_ = uStack_70;
        auVar18._0_16_ = auVar132;
        auVar18._24_8_ = uStack_68;
        auVar17 = vpaddd_avx2(auVar17,auVar18);
        auVar14 = vpsrad_avx2(auVar14,ZEXT416(6));
        auVar15 = vpsrad_avx2(auVar15,ZEXT416(6));
        auVar16 = vpsrad_avx2(auVar16,ZEXT416(6));
        auVar17 = vpsrad_avx2(auVar17,ZEXT416(6));
        auVar14 = vpackssdw_avx2(auVar14,auVar15);
        auVar15 = vpackssdw_avx2(auVar16,auVar17);
        auVar14 = vpermq_avx2(auVar14,0xd8);
        auVar15 = vpermq_avx2(auVar15,0xd8);
        auVar17._16_8_ = uStack_330;
        auVar17._0_16_ = auVar4;
        auVar17._24_8_ = uStack_328;
        auVar14 = vpminsw_avx2(auVar14,auVar17);
        auVar23._16_8_ = uStack_370;
        auVar23._0_16_ = auVar3;
        auVar23._24_8_ = uStack_368;
        auVar14 = vpmaxsw_avx2(auVar14,auVar23);
        auVar16._16_8_ = uStack_330;
        auVar16._0_16_ = auVar4;
        auVar16._24_8_ = uStack_328;
        auVar15 = vpminsw_avx2(auVar15,auVar16);
        auVar22._16_8_ = uStack_370;
        auVar22._0_16_ = auVar3;
        auVar22._24_8_ = uStack_368;
        auVar15 = vpmaxsw_avx2(auVar15,auVar22);
        auVar128._16_8_ = uStack_2f0;
        auVar128._0_16_ = auVar5;
        auVar128._24_8_ = uStack_2e8;
        auVar14 = vpblendvb_avx2(*(undefined1 (*) [32])(*local_3978 + local_4668),auVar14,auVar128);
        auVar127._16_8_ = uStack_2f0;
        auVar127._0_16_ = auVar5;
        auVar127._24_8_ = uStack_2e8;
        auVar15 = vpblendvb_avx2(*(undefined1 (*) [32])(*local_3978 + (local_4668 + 0x20)),auVar15,
                                 auVar127);
        puVar131 = (undefined8 *)(*local_3978 + local_4668);
        local_3a00 = auVar14._0_8_;
        uStack_39f8 = auVar14._8_8_;
        uStack_39f0 = auVar14._16_8_;
        uStack_39e8 = auVar14._24_8_;
        *puVar131 = local_3a00;
        puVar131[1] = uStack_39f8;
        puVar131[2] = uStack_39f0;
        puVar131[3] = uStack_39e8;
        local_3a20 = auVar15._0_8_;
        uStack_3a18 = auVar15._8_8_;
        uStack_3a10 = auVar15._16_8_;
        uStack_3a08 = auVar15._24_8_;
        *(undefined8 *)(local_3978[1] + local_4668) = local_3a20;
        *(undefined8 *)(local_3978[1] + (long)local_4668 + 8) = uStack_3a18;
        *(undefined8 *)(local_3978[1] + (long)local_4668 + 0x10) = uStack_3a10;
        *(undefined8 *)(local_3978[1] + (long)local_4668 + 0x18) = uStack_3a08;
      }
    }
    local_3988 = (undefined1 (*) [32])(*local_3988 + in_ECX);
    local_3978 = (undefined1 (*) [32])(*local_3978 + in_ESI);
  }
  return;
}

Assistant:

void uavs3d_alf_one_lcu_one_chroma_avx2(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *imgPad1, *imgPad2, *imgPad3, *imgPad4, *imgPad5, *imgPad6;

    __m256i T00, T01, T10, T11, T20, T21, T30, T31, T40, T41, T50, T51, T60, T61, T70, T71, T80, T81;
    __m256i T8;
    __m256i T000, T001, T010, T011, T100, T101, T110, T111, T200, T201, T210, T211, T310, T311, T300, T301, T400, T401, T410, T411, T500, T501, T510, T511, T600, T601, T610, T611, T700, T701, T710, T711;
    __m256i E00, E01, E10, E11;
    __m256i C0, C1, C2, C3, C4, C5, C6, C7, C8;
    __m256i S0, S00, S01, S1, S10, S11, S2, S20, S21, S3, S30, S31, S4, S40, S41, S5, S50, S51, S6, S7, S60, S61, S70, S71, S80, S81, S82, S83, SS1, SS2, SS3, SS4;
    __m256i mAddOffset;
    __m256i mZero = _mm256_set1_epi16(0);
    __m256i mMax = _mm256_set1_epi16((short)((1 << sample_bit_depth) - 1));
    __m256i uv_mask = _mm256_set1_epi16(0xff);

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;

    C0 = _mm256_set1_epi16(coef[0]);
    C1 = _mm256_set1_epi16(coef[2]);
    C2 = _mm256_set1_epi16(coef[4]);
    C3 = _mm256_set1_epi16(coef[6]);
    C4 = _mm256_set1_epi16(coef[8]);
    C5 = _mm256_set1_epi16(coef[10]);
    C6 = _mm256_set1_epi16(coef[12]);
    C7 = _mm256_set1_epi16(coef[14]);
    C8 = _mm256_set1_epi32(coef[16]);

    mAddOffset = _mm256_set1_epi32(32);

    for (i = startPos; i < endPos; i++) {
        imgPad1 = src + i_src;
        imgPad2 = src - i_src;
        imgPad3 = src + 2 * i_src;
        imgPad4 = src - 2 * i_src;
        imgPad5 = src + 3 * i_src;
        imgPad6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                imgPad4 = imgPad2 = src;
            }
            else if (i == 1) {
                imgPad4 = imgPad2;
            }
            imgPad6 = imgPad4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                imgPad3 = imgPad1 = src;
            }
            else if (i == lcu_height - 2) {
                imgPad3 = imgPad1;
            }
            imgPad5 = imgPad3;
        }

        if (lcu_width <= 16) {
            T00 = _mm256_loadu_si256((__m256i*)&imgPad6[0]);
            T000 = _mm256_and_si256(T00, uv_mask);
            T00 = _mm256_loadu_si256((__m256i*)&imgPad5[0]);
            T010 = _mm256_and_si256(T00, uv_mask);
            E00 = _mm256_add_epi16(T000, T010);
            S00 = _mm256_mullo_epi16(C0, E00);//前16个像素所有C0*P0的结果

            T10 = _mm256_loadu_si256((__m256i*)&imgPad4[0]);
            T100 = _mm256_and_si256(T10, uv_mask);
            T11 = _mm256_loadu_si256((__m256i*)&imgPad3[0]);
            T110 = _mm256_and_si256(T11, uv_mask);
            E10 = _mm256_add_epi16(T100, T110);
            S10 = _mm256_mullo_epi16(C1, E10);//前16个像素所有C1*P1的结果


            T20 = _mm256_loadu_si256((__m256i*)&imgPad2[0 - 2]);
            T200 = _mm256_and_si256(T20, uv_mask);
            T30 = _mm256_loadu_si256((__m256i*)&imgPad2[0]);
            T300 = _mm256_and_si256(T30, uv_mask);
            T40 = _mm256_loadu_si256((__m256i*)&imgPad2[0 + 2]);
            T400 = _mm256_and_si256(T40, uv_mask);

            T41 = _mm256_loadu_si256((__m256i*)&imgPad1[0 - 2]);
            T410 = _mm256_and_si256(T41, uv_mask);
            T31 = _mm256_loadu_si256((__m256i*)&imgPad1[0]);
            T310 = _mm256_and_si256(T31, uv_mask);
            T21 = _mm256_loadu_si256((__m256i*)&imgPad1[0 + 2]);
            T210 = _mm256_and_si256(T21, uv_mask);

            T20 = _mm256_add_epi16(T200, T210);
            T30 = _mm256_add_epi16(T300, T310);
            T40 = _mm256_add_epi16(T400, T410);


            S20 = _mm256_mullo_epi16(T20, C2);
            S30 = _mm256_mullo_epi16(T30, C3);
            S40 = _mm256_mullo_epi16(T40, C4);

            T50 = _mm256_loadu_si256((__m256i*)&src[0 - 6]);
            T500 = _mm256_and_si256(T50, uv_mask);
            T60 = _mm256_loadu_si256((__m256i*)&src[0 - 4]);
            T600 = _mm256_and_si256(T60, uv_mask);
            T70 = _mm256_loadu_si256((__m256i*)&src[0 - 2]);
            T700 = _mm256_and_si256(T70, uv_mask);
            T8 = _mm256_loadu_si256((__m256i*)&src[0]);
            T80 = _mm256_and_si256(T8, uv_mask);
            T71 = _mm256_loadu_si256((__m256i*)&src[0 + 2]);
            T710 = _mm256_and_si256(T71, uv_mask);
            T61 = _mm256_loadu_si256((__m256i*)&src[0 + 4]);
            T610 = _mm256_and_si256(T61, uv_mask);
            T51 = _mm256_loadu_si256((__m256i*)&src[0 + 6]);
            T510 = _mm256_and_si256(T51, uv_mask);

            T50 = _mm256_add_epi16(T500, T510);
            T60 = _mm256_add_epi16(T600, T610);
            T70 = _mm256_add_epi16(T700, T710);

            S50 = _mm256_mullo_epi16(T50, C5);
            S60 = _mm256_mullo_epi16(T60, C6);
            S70 = _mm256_mullo_epi16(T70, C7);

            S80 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T80));
            S81 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T80, 1));
            S80 = _mm256_mullo_epi16(S80, C8);
            S81 = _mm256_mullo_epi16(S81, C8);

            S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S00));
            S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S10));
            S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S20));
            S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S30));
            S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S40));
            S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S50));
            S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S60));
            S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S70));
            S0 = _mm256_add_epi32(S0, S1);
            S2 = _mm256_add_epi32(S2, S3);
            S4 = _mm256_add_epi32(S4, S5);
            S6 = _mm256_add_epi32(S6, S7);
            S0 = _mm256_add_epi32(S0, S2);
            S4 = _mm256_add_epi32(S4, S6);
            SS1 = _mm256_add_epi32(S0, S4);
            SS1 = _mm256_add_epi32(SS1, S80);    //0-7

            S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S00, 1));
            S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S10, 1));
            S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S20, 1));
            S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S30, 1));
            S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S40, 1));
            S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S50, 1));
            S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S60, 1));
            S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S70, 1));
            //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S80, 1));
            S0 = _mm256_add_epi32(S0, S1);
            S2 = _mm256_add_epi32(S2, S3);
            S4 = _mm256_add_epi32(S4, S5);
            S6 = _mm256_add_epi32(S6, S7);
            S0 = _mm256_add_epi32(S0, S2);
            S4 = _mm256_add_epi32(S4, S6);
            SS2 = _mm256_add_epi32(S0, S4);
            SS2 = _mm256_add_epi32(SS2, S81);    //8-15

            SS1 = _mm256_add_epi32(SS1, mAddOffset);
            SS2 = _mm256_add_epi32(SS2, mAddOffset);

            SS1 = _mm256_srai_epi32(SS1, 6);
            SS2 = _mm256_srai_epi32(SS2, 6);

            SS1 = _mm256_packs_epi32(SS1, SS2);
            SS1 = _mm256_permute4x64_epi64(SS1, 0xd8);

            T00 = _mm256_loadu_si256((__m256i*)&dst[0]);

            SS1 = _mm256_min_epi16(SS1, mMax);
            SS1 = _mm256_max_epi16(SS1, mZero);

            T00 = _mm256_blendv_epi8(T00, SS1, uv_mask);
            _mm256_storeu_si256((__m256i*)(dst), T00);
        }
        else {
            for (j = 0; j < lcu_width << 1; j += 64) {
                T00 = _mm256_loadu_si256((__m256i*)&imgPad6[j]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad6[j + 32]);
                T000 = _mm256_and_si256(T00, uv_mask);
                T001 = _mm256_and_si256(T01, uv_mask);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad5[j]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad5[j + 32]);
                T010 = _mm256_and_si256(T00, uv_mask);
                T011 = _mm256_and_si256(T01, uv_mask);
                E00 = _mm256_add_epi16(T000, T010);
                E01 = _mm256_add_epi16(T001, T011);
                S00 = _mm256_mullo_epi16(C0, E00);//前16个像素所有C0*P0的结果
                S01 = _mm256_mullo_epi16(C0, E01);//后16个像素所有C0*P0的结果

                T10 = _mm256_loadu_si256((__m256i*)&imgPad4[j]);
                T11 = _mm256_loadu_si256((__m256i*)&imgPad4[j + 32]);
                T100 = _mm256_and_si256(T10, uv_mask);
                T101 = _mm256_and_si256(T11, uv_mask);
                T11 = _mm256_loadu_si256((__m256i*)&imgPad3[j]);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad3[j + 32]);
                T110 = _mm256_and_si256(T11, uv_mask);
                T111 = _mm256_and_si256(T00, uv_mask);
                E10 = _mm256_add_epi16(T100, T110);
                E11 = _mm256_add_epi16(T101, T111);
                S10 = _mm256_mullo_epi16(C1, E10);//前16个像素所有C1*P1的结果
                S11 = _mm256_mullo_epi16(C1, E11);//后16个像素所有C1*P1的结果


                T20 = _mm256_loadu_si256((__m256i*)&imgPad2[j - 2]);
                T30 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 30]);
                T200 = _mm256_and_si256(T20, uv_mask);
                T201 = _mm256_and_si256(T30, uv_mask);
                T30 = _mm256_loadu_si256((__m256i*)&imgPad2[j]);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 32]);
                T300 = _mm256_and_si256(T30, uv_mask);
                T301 = _mm256_and_si256(T40, uv_mask);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 2]);
                T41 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 34]);
                T400 = _mm256_and_si256(T40, uv_mask);
                T401 = _mm256_and_si256(T41, uv_mask);

                T41 = _mm256_loadu_si256((__m256i*)&imgPad1[j - 2]);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 30]);
                T410 = _mm256_and_si256(T41, uv_mask);
                T411 = _mm256_and_si256(T40, uv_mask);
                T31 = _mm256_loadu_si256((__m256i*)&imgPad1[j]);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 32]);
                T310 = _mm256_and_si256(T31, uv_mask);
                T311 = _mm256_and_si256(T00, uv_mask);
                T21 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 2]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 34]);
                T210 = _mm256_and_si256(T21, uv_mask);
                T211 = _mm256_and_si256(T01, uv_mask);

                T20 = _mm256_add_epi16(T200, T210); // 前16个数
                T21 = _mm256_add_epi16(T201, T211); //后16个数
                T30 = _mm256_add_epi16(T300, T310);
                T31 = _mm256_add_epi16(T301, T311);
                T40 = _mm256_add_epi16(T400, T410);
                T41 = _mm256_add_epi16(T401, T411);


                S20 = _mm256_mullo_epi16(T20, C2);
                S21 = _mm256_mullo_epi16(T21, C2);
                S30 = _mm256_mullo_epi16(T30, C3);
                S31 = _mm256_mullo_epi16(T31, C3);
                S40 = _mm256_mullo_epi16(T40, C4);
                S41 = _mm256_mullo_epi16(T41, C4);

                T50 = _mm256_loadu_si256((__m256i*)&src[j - 6]);
                T00 = _mm256_loadu_si256((__m256i*)&src[j + 26]);
                T500 = _mm256_and_si256(T50, uv_mask);
                T501 = _mm256_and_si256(T00, uv_mask);
                T60 = _mm256_loadu_si256((__m256i*)&src[j - 4]);
                T20 = _mm256_loadu_si256((__m256i*)&src[j + 28]);
                T600 = _mm256_and_si256(T60, uv_mask);
                T601 = _mm256_and_si256(T20, uv_mask);
                T70 = _mm256_loadu_si256((__m256i*)&src[j - 2]);
                T30 = _mm256_loadu_si256((__m256i*)&src[j + 30]);
                T700 = _mm256_and_si256(T70, uv_mask);
                T701 = _mm256_and_si256(T30, uv_mask);
                T8 = _mm256_loadu_si256((__m256i*)&src[j]);
                T01 = _mm256_loadu_si256((__m256i*)&src[j + 32]);
                T80 = _mm256_and_si256(T8, uv_mask);
                T81 = _mm256_and_si256(T01, uv_mask);
                T71 = _mm256_loadu_si256((__m256i*)&src[j + 2]);
                T11 = _mm256_loadu_si256((__m256i*)&src[j + 34]);
                T710 = _mm256_and_si256(T71, uv_mask);
                T711 = _mm256_and_si256(T11, uv_mask);
                T61 = _mm256_loadu_si256((__m256i*)&src[j + 4]);
                T21 = _mm256_loadu_si256((__m256i*)&src[j + 36]);
                T610 = _mm256_and_si256(T61, uv_mask);
                T611 = _mm256_and_si256(T21, uv_mask);
                T51 = _mm256_loadu_si256((__m256i*)&src[j + 6]);
                T31 = _mm256_loadu_si256((__m256i*)&src[j + 38]);
                T510 = _mm256_and_si256(T51, uv_mask);
                T511 = _mm256_and_si256(T31, uv_mask);

                T50 = _mm256_add_epi16(T500, T510);
                T51 = _mm256_add_epi16(T501, T511);
                T60 = _mm256_add_epi16(T600, T610);
                T61 = _mm256_add_epi16(T601, T611);
                T70 = _mm256_add_epi16(T700, T710);
                T71 = _mm256_add_epi16(T701, T711);

                S50 = _mm256_mullo_epi16(T50, C5);
                S51 = _mm256_mullo_epi16(T51, C5);
                S60 = _mm256_mullo_epi16(T60, C6);
                S61 = _mm256_mullo_epi16(T61, C6);
                S70 = _mm256_mullo_epi16(T70, C7);
                S71 = _mm256_mullo_epi16(T71, C7);

                S80 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T80));
                S81 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T80, 1));
                S82 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T81));
                S83 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T81, 1));
                S80 = _mm256_mullo_epi16(S80, C8);
                S81 = _mm256_mullo_epi16(S81, C8);
                S82 = _mm256_mullo_epi16(S82, C8);
                S83 = _mm256_mullo_epi16(S83, C8);

                S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S00));
                S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S10));
                S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S20));
                S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S30));
                S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S40));
                S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S50));
                S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S60));
                S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S70));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS1 = _mm256_add_epi32(S0, S4);
                SS1 = _mm256_add_epi32(SS1, S80);    //0-7

                S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S00, 1));
                S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S10, 1));
                S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S20, 1));
                S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S30, 1));
                S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S40, 1));
                S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S50, 1));
                S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S60, 1));
                S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S70, 1));
                //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S80, 1));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS2 = _mm256_add_epi32(S0, S4);
                SS2 = _mm256_add_epi32(SS2, S81);    //8-15

                S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S01));
                S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S11));
                S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S21));
                S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S31));
                S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S41));
                S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S51));
                S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S61));
                S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S71));
                //S8 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S81));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS3 = _mm256_add_epi32(S0, S4);
                SS3 = _mm256_add_epi32(SS3, S82);    //16-23

                S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S01, 1));
                S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S11, 1));
                S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S21, 1));
                S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S31, 1));
                S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S41, 1));
                S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S51, 1));
                S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S61, 1));
                S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S71, 1));
                //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S81, 1));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS4 = _mm256_add_epi32(S0, S4);
                SS4 = _mm256_add_epi32(SS4, S83);    //24-31

                SS1 = _mm256_add_epi32(SS1, mAddOffset);
                SS2 = _mm256_add_epi32(SS2, mAddOffset);
                SS3 = _mm256_add_epi32(SS3, mAddOffset);
                SS4 = _mm256_add_epi32(SS4, mAddOffset);

                SS1 = _mm256_srai_epi32(SS1, 6);
                SS2 = _mm256_srai_epi32(SS2, 6);
                SS3 = _mm256_srai_epi32(SS3, 6);
                SS4 = _mm256_srai_epi32(SS4, 6);

                SS1 = _mm256_packs_epi32(SS1, SS2);
                SS3 = _mm256_packs_epi32(SS3, SS4);
                SS1 = _mm256_permute4x64_epi64(SS1, 0xd8);
                SS3 = _mm256_permute4x64_epi64(SS3, 0xd8);

                T00 = _mm256_loadu_si256((__m256i*)&dst[j]);
                T01 = _mm256_loadu_si256((__m256i*)&dst[j + 32]);

                SS1 = _mm256_min_epi16(SS1, mMax);
                SS1 = _mm256_max_epi16(SS1, mZero);
                SS3 = _mm256_min_epi16(SS3, mMax);
                SS3 = _mm256_max_epi16(SS3, mZero);

                T00 = _mm256_blendv_epi8(T00, SS1, uv_mask);
                T01 = _mm256_blendv_epi8(T01, SS3, uv_mask);
                _mm256_storeu_si256((__m256i*)(dst + j), T00);
                _mm256_storeu_si256((__m256i*)(dst + j + 32), T01);
            }
        }
        src += i_src;
        dst += i_dst;
    }
}